

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timeline.cpp
# Opt level: O0

void __thiscall
CMU462::Timeline::drawCircle(Timeline *this,double cx,double cy,double r,int num_segments)

{
  float fVar1;
  float fVar2;
  double dVar3;
  double dVar4;
  double dy;
  double dx;
  double theta;
  int i;
  int num_segments_local;
  double r_local;
  double cy_local;
  double cx_local;
  Timeline *this_local;
  
  glBegin(2);
  for (theta._0_4_ = 0; theta._0_4_ < num_segments; theta._0_4_ = theta._0_4_ + 1) {
    fVar2 = ((float)theta._0_4_ * 6.283185) / (float)num_segments;
    fVar1 = cosf(fVar2);
    fVar2 = sinf(fVar2);
    dVar3 = cx + r * (double)fVar1;
    dVar4 = cy + r * (double)fVar2;
    glVertex2f(CONCAT44((int)((ulong)dVar3 >> 0x20),(float)dVar3),
               CONCAT44((int)((ulong)dVar4 >> 0x20),(float)dVar4));
  }
  glEnd();
  return;
}

Assistant:

void Timeline::drawCircle(double cx, double cy, double r, int num_segments)
  {
    glBegin(GL_LINE_LOOP);
    for (int i = 0; i < num_segments; i++)
	{
	  // Current Angle.
	  double theta = 2.0 * 3.1415926 * float(i) / float(num_segments);
	  double dx = r * cosf(theta);
	  double dy = r * sinf(theta);
	  glVertex2f(cx + dx, cy + dy);
    }
    glEnd();
  }